

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O1

void __thiscall
Assimp::ComputeUVMappingProcess::ComputeSphereMapping
          (ComputeUVMappingProcess *this,aiMesh *mesh,aiVector3D *axis,aiVector3D *out)

{
  aiVector3D *paVar1;
  ulong uVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  aiVector3D center;
  aiVector3D max;
  aiVector3D min;
  aiVector3D local_8c;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  aiMatrix3x3t<float> local_5c;
  aiVector3D local_38;
  aiVector3D local_2c;
  
  local_8c.x = 0.0;
  local_8c.y = 0.0;
  local_8c.z = 0.0;
  local_2c.x = 0.0;
  local_2c.y = 0.0;
  local_2c.z = 0.0;
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.z = 0.0;
  FindMeshCenter(mesh,&local_8c,&local_2c,&local_38);
  fVar5 = axis->x;
  fVar6 = axis->y * 0.0;
  fVar8 = axis->z * 0.0;
  if (0.95 <= fVar5 + fVar6 + fVar8) {
    if (mesh->mNumVertices != 0) {
      lVar3 = 8;
      uVar2 = 0;
      do {
        paVar1 = mesh->mVertices;
        fVar6 = *(float *)((long)paVar1 + lVar3 + -8) - local_8c.x;
        fVar8 = *(float *)((long)paVar1 + lVar3 + -4) - local_8c.y;
        fVar4 = *(float *)((long)&paVar1->x + lVar3) - local_8c.z;
        fVar5 = fVar4 * fVar4 + fVar6 * fVar6 + fVar8 * fVar8;
        if (fVar5 < 0.0) {
          fVar5 = sqrtf(fVar5);
        }
        else {
          fVar5 = SQRT(fVar5);
        }
        fVar5 = 1.0 / fVar5;
        fVar8 = atan2f(fVar4 * fVar5,fVar8 * fVar5);
        fVar5 = asinf(fVar6 * fVar5);
        *(float *)((long)out + lVar3 + -8) = (fVar8 + 3.1415927) / 6.2831855;
        *(float *)((long)out + lVar3 + -4) = (fVar5 + 1.5707964) / 3.1415927;
        *(undefined4 *)((long)&out->x + lVar3) = 0;
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar2 < mesh->mNumVertices);
    }
  }
  else if (0.95 <= fVar8 + fVar5 * 0.0 + axis->y) {
    if (mesh->mNumVertices != 0) {
      lVar3 = 8;
      uVar2 = 0;
      do {
        paVar1 = mesh->mVertices;
        fVar8 = *(float *)((long)paVar1 + lVar3 + -8) - local_8c.x;
        fVar5 = *(float *)((long)paVar1 + lVar3 + -4) - local_8c.y;
        fVar4 = *(float *)((long)&paVar1->x + lVar3) - local_8c.z;
        fVar6 = fVar4 * fVar4 + fVar8 * fVar8 + fVar5 * fVar5;
        if (fVar6 < 0.0) {
          fVar6 = sqrtf(fVar6);
        }
        else {
          fVar6 = SQRT(fVar6);
        }
        fVar6 = 1.0 / fVar6;
        fVar8 = atan2f(fVar8 * fVar6,fVar4 * fVar6);
        fVar5 = asinf(fVar5 * fVar6);
        *(float *)((long)out + lVar3 + -8) = (fVar8 + 3.1415927) / 6.2831855;
        *(float *)((long)out + lVar3 + -4) = (fVar5 + 1.5707964) / 3.1415927;
        *(undefined4 *)((long)&out->x + lVar3) = 0;
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar2 < mesh->mNumVertices);
    }
  }
  else if (0.95 <= axis->z + fVar5 * 0.0 + fVar6) {
    if (mesh->mNumVertices != 0) {
      lVar3 = 8;
      uVar2 = 0;
      do {
        paVar1 = mesh->mVertices;
        fVar8 = *(float *)((long)paVar1 + lVar3 + -8) - local_8c.x;
        fVar4 = *(float *)((long)paVar1 + lVar3 + -4) - local_8c.y;
        fVar6 = *(float *)((long)&paVar1->x + lVar3) - local_8c.z;
        fVar5 = fVar6 * fVar6 + fVar8 * fVar8 + fVar4 * fVar4;
        if (fVar5 < 0.0) {
          fVar5 = sqrtf(fVar5);
        }
        else {
          fVar5 = SQRT(fVar5);
        }
        fVar5 = 1.0 / fVar5;
        fVar8 = atan2f(fVar4 * fVar5,fVar8 * fVar5);
        fVar5 = asinf(fVar6 * fVar5);
        *(float *)((long)out + lVar3 + -8) = (fVar8 + 3.1415927) / 6.2831855;
        *(float *)((long)out + lVar3 + -4) = (fVar5 + 1.5707964) / 3.1415927;
        *(undefined4 *)((long)&out->x + lVar3) = 0;
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar2 < mesh->mNumVertices);
    }
  }
  else {
    local_5c.a1 = 1.0;
    local_5c.a2 = 0.0;
    local_5c.a3 = 0.0;
    local_5c.b1 = 0.0;
    local_5c.b2 = 1.0;
    local_5c.b3 = 0.0;
    local_5c.c1 = 0.0;
    local_5c.c2 = 0.0;
    local_5c.c3 = 1.0;
    aiMatrix3x3t<float>::FromToMatrix
              (axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_y,&local_5c);
    if (mesh->mNumVertices != 0) {
      fVar5 = local_5c.a1;
      local_60 = local_5c.a2;
      local_64 = local_5c.a3;
      local_68 = local_5c.b1;
      local_6c = local_5c.b2;
      local_70 = local_5c.b3;
      local_74 = local_5c.c1;
      local_78 = local_5c.c2;
      local_7c = local_5c.c3;
      lVar3 = 8;
      uVar2 = 0;
      do {
        paVar1 = mesh->mVertices;
        fVar6 = *(float *)((long)paVar1 + lVar3 + -8);
        fVar8 = *(float *)((long)paVar1 + lVar3 + -4);
        fVar4 = *(float *)((long)&paVar1->x + lVar3);
        fVar9 = (local_64 * fVar4 + fVar5 * fVar6 + local_60 * fVar8 + 0.0) - local_8c.x;
        fVar7 = (local_70 * fVar4 + local_68 * fVar6 + local_6c * fVar8 + 0.0) - local_8c.y;
        fVar8 = (fVar4 * local_7c + fVar6 * local_74 + fVar8 * local_78 + 0.0) - local_8c.z;
        fVar6 = fVar8 * fVar8 + fVar9 * fVar9 + fVar7 * fVar7;
        if (fVar6 < 0.0) {
          local_80 = fVar7;
          fVar6 = sqrtf(fVar6);
          fVar7 = local_80;
        }
        else {
          fVar6 = SQRT(fVar6);
        }
        fVar6 = 1.0 / fVar6;
        fVar4 = atan2f(fVar7 * fVar6,fVar9 * fVar6);
        fVar6 = asinf(fVar8 * fVar6);
        *(float *)((long)out + lVar3 + -8) = (fVar4 + 3.1415927) / 6.2831855;
        *(float *)((long)out + lVar3 + -4) = (fVar6 + 1.5707964) / 3.1415927;
        *(undefined4 *)((long)&out->x + lVar3) = 0;
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar2 < mesh->mNumVertices);
    }
  }
  RemoveUVSeams(mesh,out);
  return;
}

Assistant:

void ComputeUVMappingProcess::ComputeSphereMapping(aiMesh* mesh,const aiVector3D& axis, aiVector3D* out)
{
    aiVector3D center, min, max;
    FindMeshCenter(mesh, center, min, max);

    // If the axis is one of x,y,z run a faster code path. It's worth the extra effort ...
    // currently the mapping axis will always be one of x,y,z, except if the
    // PretransformVertices step is used (it transforms the meshes into worldspace,
    // thus changing the mapping axis)
    if (axis * base_axis_x >= angle_epsilon)    {

        // For each point get a normalized projection vector in the sphere,
        // get its longitude and latitude and map them to their respective
        // UV axes. Problems occur around the poles ... unsolvable.
        //
        // The spherical coordinate system looks like this:
        // x = cos(lon)*cos(lat)
        // y = sin(lon)*cos(lat)
        // z = sin(lat)
        //
        // Thus we can derive:
        // lat  = arcsin (z)
        // lon  = arctan (y/x)
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = (mesh->mVertices[pnt]-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.z, diff.y) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin  (diff.x) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }
    else if (axis * base_axis_y >= angle_epsilon)   {
        // ... just the same again
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = (mesh->mVertices[pnt]-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.x, diff.z) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin  (diff.y) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }
    else if (axis * base_axis_z >= angle_epsilon)   {
        // ... just the same again
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = (mesh->mVertices[pnt]-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.y, diff.x) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin  (diff.z) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }
    // slower code path in case the mapping axis is not one of the coordinate system axes
    else    {
        aiMatrix4x4 mTrafo;
        aiMatrix4x4::FromToMatrix(axis,base_axis_y,mTrafo);

        // again the same, except we're applying a transformation now
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = ((mTrafo*mesh->mVertices[pnt])-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.y, diff.x) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin(diff.z) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }


    // Now find and remove UV seams. A seam occurs if a face has a tcoord
    // close to zero on the one side, and a tcoord close to one on the
    // other side.
    RemoveUVSeams(mesh,out);
}